

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O0

void BinaryCache::RemoveBytecode(char *path)

{
  undefined *puVar1;
  uint uVar2;
  uint uVar3;
  CodeDescriptor *pCVar4;
  CodeDescriptor *__dest;
  uint local_18;
  uint i;
  uint hash;
  char *path_local;
  
  uVar2 = NULLC::GetStringHash(path);
  local_18 = 0;
  while ((uVar3 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::size
                            ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache),
         local_18 < uVar3 &&
         (pCVar4 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                             ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache,
                              local_18), uVar2 != pCVar4->nameHash))) {
    local_18 = local_18 + 1;
  }
  uVar2 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::size
                    ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache);
  puVar1 = NULLC::dealloc;
  if (local_18 != uVar2) {
    pCVar4 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache,local_18);
    (*(code *)puVar1)(pCVar4->name);
    pCVar4 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache,local_18);
    if (pCVar4->binary != (char *)0x0) {
      operator_delete__(pCVar4->binary);
    }
    pCVar4 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache,local_18);
    if (pCVar4->lexemes != (Lexeme *)0x0) {
      operator_delete__(pCVar4->lexemes);
    }
    pCVar4 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::back
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache);
    __dest = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache,local_18);
    memcpy(__dest,pCVar4,0x28);
    FastVector<BinaryCache::CodeDescriptor,_false,_false>::pop_back
              ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache);
  }
  return;
}

Assistant:

void BinaryCache::RemoveBytecode(const char* path)
{
	unsigned int hash = NULLC::GetStringHash(path);
	unsigned int i = 0;
	for(; i < cache.size(); i++)
	{
		if(hash == cache[i].nameHash)
			break;
	}
	if(i == cache.size())
		return;

	NULLC::dealloc((void*)cache[i].name);
	delete[] cache[i].binary;
	delete[] cache[i].lexemes;

	cache[i] = cache.back();
	cache.pop_back();
}